

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_init(ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,void *pUserData,
                         ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result result;
  ma_decoder_config config;
  ma_decoder *in_stack_fffffffffffffea8;
  ma_decoder_config *in_stack_fffffffffffffeb0;
  void *in_stack_fffffffffffffeb8;
  ma_decoder *in_stack_fffffffffffffec0;
  ma_decoder_config *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  ma_decoder_tell_proc in_stack_fffffffffffffed8;
  ma_decoder_seek_proc in_stack_fffffffffffffee0;
  ma_decoder_read_proc in_stack_fffffffffffffee8;
  undefined1 local_c0 [188];
  ma_result local_4;
  
  ma_decoder_config_init_copy(in_stack_fffffffffffffeb0);
  memcpy(local_c0,&stack0xfffffffffffffea8,0x90);
  local_4 = ma_decoder__preinit(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  if (local_4 == MA_SUCCESS) {
    local_4 = ma_decoder_init__internal
                        ((ma_decoder_read_proc)in_stack_fffffffffffffec8,
                         (ma_decoder_seek_proc)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_decoder_init(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_decoder_config config;
    ma_result result;

    config = ma_decoder_config_init_copy(pConfig);

    result = ma_decoder__preinit(onRead, onSeek, NULL, pUserData, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_decoder_init__internal(onRead, onSeek, pUserData, &config, pDecoder);
}